

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

shared_ptr<chrono::ChLinkMotorRotationSpeed> __thiscall
chrono::turtlebot::AddMotor
          (turtlebot *this,shared_ptr<chrono::ChBody> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,shared_ptr<chrono::ChBodyAuxRef> *chassis,
          ChSystem *system,ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot,
          shared_ptr<chrono::ChFunction_Const> *speed_func)

{
  ChFrame<double> *this_00;
  element_type *peVar1;
  ChFrame<double> *this_01;
  element_type *peVar2;
  ChCoordsys<double> *mv;
  ChCoordsys<double> *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> sVar4;
  shared_ptr<chrono::ChFunction> local_228;
  shared_ptr<chrono::ChLinkBase> local_218;
  ChFrame<double> local_208;
  shared_ptr<chrono::ChBodyFrame> local_180;
  shared_ptr<chrono::ChBodyFrame> local_170;
  undefined1 local_15d;
  undefined1 local_150 [8];
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  ChFrame<double> *X_GP;
  ChVector<double> *rel_joint_pos_local;
  ChSystem *system_local;
  shared_ptr<chrono::ChBodyAuxRef> *chassis_local;
  shared_ptr<chrono::ChBodyAuxRef> *body_2_local;
  shared_ptr<chrono::ChBody> *body_1_local;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> *motor_angle;
  
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)chassis);
  this_01 = (ChFrame<double> *)(**(code **)(*(long *)peVar1 + 0x1f0))();
  this_00 = (ChFrame<double> *)
            ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x40);
  ChFrame<double>::ChFrame(this_00,rel_joint_pos,rel_joint_rot);
  ChFrame<double>::operator*((ChFrame<double> *)local_150,this_01,this_00);
  local_15d = 0;
  chrono_types::make_shared<chrono::ChLinkMotorRotationSpeed,_0>();
  peVar2 = std::
           __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>(&local_170,body_1);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_180,body_2);
  mv = ChFrame<double>::GetCoord((ChFrame<double> *)local_150);
  pCVar3 = ChFrame<double>::GetCoord((ChFrame<double> *)local_150);
  ChFrame<double>::ChFrame(&local_208,&mv->pos,&pCVar3->rot);
  (**(code **)(*(long *)peVar2 + 0x240))(peVar2,&local_170,&local_180,&local_208);
  ChFrame<double>::~ChFrame(&local_208);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_180);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_170);
  std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkMotorRotationSpeed,void>
            (&local_218,(shared_ptr<chrono::ChLinkMotorRotationSpeed> *)this);
  (**(code **)(*(long *)system + 0x138))(system,&local_218);
  std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_218);
  peVar2 = std::
           __shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Const,void>
            (&local_228,speed_func);
  ChLinkMotorRotationSpeed::SetSpeedFunction(peVar2,&local_228);
  std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_228);
  local_15d = 1;
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_150);
  ChFrame<double>::~ChFrame
            ((ChFrame<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  sVar4.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationSpeed>)
         sVar4.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationSpeed> AddMotor(std::shared_ptr<ChBody> body_1,
                                                   std::shared_ptr<ChBodyAuxRef> body_2,
                                                   std::shared_ptr<ChBodyAuxRef> chassis,
                                                   ChSystem* system,
                                                   const ChVector<>& rel_joint_pos,
                                                   const ChQuaternion<>& rel_joint_rot,
                                                   std::shared_ptr<ChFunction_Const> speed_func) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    auto motor_angle = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
    motor_angle->Initialize(body_1, body_2, ChFrame<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(motor_angle);
    motor_angle->SetSpeedFunction(speed_func);
    return motor_angle;
}